

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  uint n;
  sqlite3 *db_00;
  size_t sVar1;
  int iVar2;
  bool bVar3;
  sqlite3 *db;
  char *zColAff;
  int i;
  int iReg_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  db = (sqlite3 *)pTab->zColAff;
  if (db == (sqlite3 *)0x0) {
    db_00 = sqlite3VdbeDb(v);
    db = (sqlite3 *)sqlite3DbMallocRaw((sqlite3 *)0x0,(long)(pTab->nCol + 1));
    if (db == (sqlite3 *)0x0) {
      sqlite3OomFault(db_00);
      return;
    }
    for (zColAff._0_4_ = 0; (int)zColAff < pTab->nCol; zColAff._0_4_ = (int)zColAff + 1) {
      *(char *)((long)db->aLimit + (long)(int)zColAff + -0x7c) = pTab->aCol[(int)zColAff].affinity;
    }
    do {
      iVar2 = (int)zColAff + -1;
      *(undefined1 *)((long)db->aLimit + (long)(int)zColAff + -0x7c) = 0;
      bVar3 = false;
      if (-1 < iVar2) {
        bVar3 = *(char *)((long)db->aLimit + (long)iVar2 + -0x7c) == 'A';
      }
      zColAff._0_4_ = iVar2;
    } while (bVar3);
    pTab->zColAff = (char *)db;
  }
  sVar1 = strlen((char *)db);
  n = (uint)sVar1 & 0x3fffffff;
  if ((sVar1 & 0x3fffffff) != 0) {
    if (iReg == 0) {
      sqlite3VdbeChangeP4(v,-1,(char *)db,n);
    }
    else {
      sqlite3VdbeAddOp4(v,0x5b,iReg,n,0,(char *)db,n);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff = pTab->zColAff;
  if( zColAff==0 ){
    sqlite3 *db = sqlite3VdbeDb(v);
    zColAff = (char *)sqlite3DbMallocRaw(0, pTab->nCol+1);
    if( !zColAff ){
      sqlite3OomFault(db);
      return;
    }

    for(i=0; i<pTab->nCol; i++){
      zColAff[i] = pTab->aCol[i].affinity;
    }
    do{
      zColAff[i--] = 0;
    }while( i>=0 && zColAff[i]==SQLITE_AFF_BLOB );
    pTab->zColAff = zColAff;
  }
  assert( zColAff!=0 );
  i = sqlite3Strlen30NN(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}